

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O1

int CVmObjString::getp_split(vm_val_t *retval,vm_val_t *self_val,char *str,uint *argcp)

{
  vm_val_t *this;
  anon_union_8_8_cb74652f_for_val aVar1;
  bool bVar2;
  undefined4 uVar3;
  vm_val_t *pvVar4;
  CVmObjPageEntry *pCVar5;
  int iVar6;
  int32_t iVar7;
  int iVar8;
  vm_obj_id_t vVar9;
  byte *pbVar10;
  char *pcVar11;
  ulong uVar12;
  size_t len;
  uint16_t tmp;
  ulong uVar13;
  uint uVar14;
  byte *str_00;
  uint uVar15;
  size_t bytelen;
  long lVar16;
  int match_ofs;
  CVmObjPattern *local_80;
  char *local_78;
  int match_len;
  CVmObjPageEntry *local_68;
  uint local_60;
  uint local_5c;
  vm_val_t *local_58;
  ulong local_50;
  byte *local_48;
  vm_val_t ele;
  
  local_58 = self_val;
  if (getp_split(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') {
    getp_split();
  }
  if (argcp == (uint *)0x0) {
    uVar14 = 0;
  }
  else {
    uVar14 = *argcp;
  }
  iVar6 = CVmObject::get_prop_check_argc(retval,argcp,&getp_split::desc);
  pvVar4 = sp_;
  if (iVar6 != 0) {
    return 1;
  }
  len = (size_t)*(ushort *)str;
  if (uVar14 == 0) {
    uVar15 = 1;
LAB_00288e1f:
    local_78 = (char *)0x0;
    local_80 = (CVmObjPattern *)0x0;
  }
  else {
    this = sp_ + -1;
    if (this->typ == VM_NIL) {
      local_78 = (char *)0x0;
      local_80 = (CVmObjPattern *)0x0;
      uVar15 = 1;
    }
    else {
      if (this->typ == VM_INT) {
        uVar15 = sp_[-1].val.intval;
        if ((int)uVar15 < 1) goto LAB_002891f7;
        goto LAB_00288e1f;
      }
      local_78 = vm_val_t::get_as_string(this);
      if (local_78 == (char *)0x0) {
        if ((this->typ != VM_OBJ) ||
           (uVar15 = pvVar4[-1].val.obj,
           iVar6 = (**(code **)(*(long *)&G_obj_table_X.pages_[uVar15 >> 0xc][uVar15 & 0xfff].ptr_ +
                               8))(G_obj_table_X.pages_[uVar15 >> 0xc] + (uVar15 & 0xfff),
                                   CVmObjPattern::metaclass_reg_), iVar6 == 0)) {
          err_throw(0x900);
        }
        uVar15 = pvVar4[-1].val.obj;
        local_80 = (CVmObjPattern *)
                   ((long)&G_obj_table_X.pages_[uVar15 >> 0xc]->ptr_ +
                   (ulong)((uVar15 & 0xfff) * 0x18));
        local_78 = (char *)0x0;
      }
      else {
        local_80 = (CVmObjPattern *)0x0;
      }
      uVar15 = 0;
    }
  }
  iVar7 = -1;
  if ((1 < uVar14) && (sp_[-2].typ != VM_NIL)) {
    if (sp_[-2].typ == VM_INT) {
      iVar7 = sp_[-2].val.intval;
    }
    else {
      iVar7 = vm_val_t::nonint_num_to_int(sp_ + -2);
    }
    if (iVar7 < 1) {
LAB_002891f7:
      err_throw(0x902);
    }
  }
  pvVar4 = sp_;
  uVar3 = *(undefined4 *)&local_58->field_0x4;
  aVar1 = local_58->val;
  sp_ = sp_ + 1;
  pvVar4->typ = local_58->typ;
  *(undefined4 *)&pvVar4->field_0x4 = uVar3;
  pvVar4->val = aVar1;
  local_50 = (ulong)uVar15;
  iVar6 = iVar7;
  if (iVar7 < 1) {
    if (uVar15 == 0) {
      iVar6 = 10;
    }
    else {
      iVar8 = (int)(((len + local_50) - 1) / local_50);
      iVar6 = 1;
      if (1 < iVar8) {
        iVar6 = iVar8;
      }
      if (len == 0) {
        iVar6 = iVar8;
      }
    }
  }
  local_60 = uVar14;
  vVar9 = CVmObjList::create(0,(long)iVar6);
  retval->typ = VM_OBJ;
  (retval->val).obj = vVar9;
  local_68 = G_obj_table_X.pages_[vVar9 >> 0xc] + (vVar9 & 0xfff);
  uVar13 = (ulong)**(ushort **)((long)&local_68->ptr_ + 8);
  if (uVar13 != 0) {
    CVmObjList::cons_clear((CVmObjList *)local_68,0,uVar13 - 1);
  }
  pvVar4 = sp_;
  str_00 = (byte *)(str + 2);
  uVar3 = *(undefined4 *)&retval->field_0x4;
  aVar1 = retval->val;
  sp_ = sp_ + 1;
  pvVar4->typ = retval->typ;
  *(undefined4 *)&pvVar4->field_0x4 = uVar3;
  pvVar4->val = aVar1;
  uVar13 = 0;
  local_5c = uVar15;
  local_48 = str_00;
  do {
    if (iVar7 < 0) {
      if (len == 0) {
        len = 0;
LAB_0028916c:
        pCVar5 = local_68;
        if (len != 0) {
          CVmObjList::cons_ensure_space((CVmObjList *)local_68,uVar13 & 0xffffffff,0);
          ele.val.obj = create(0,(char *)str_00,len);
          ele.typ = VM_OBJ;
          CVmObjList::cons_set_element((CVmObjList *)pCVar5,uVar13 & 0xffffffff,&ele);
          uVar13 = (ulong)((int)uVar13 + 1);
        }
        **(undefined2 **)((long)&pCVar5->ptr_ + 8) = (short)uVar13;
        sp_ = sp_ + -(long)(int)(local_60 + 2);
        return 1;
      }
    }
    else if ((iVar7 <= (int)uVar13 + 1) || (len == 0)) goto LAB_0028916c;
    pbVar10 = str_00;
    uVar12 = local_50;
    if (uVar15 == 0) {
      pcVar11 = find_substr(local_58,(char *)local_48,(char *)str_00,len,local_78,local_80,
                            &match_ofs,&match_len);
      if (pcVar11 != (char *)0x0) {
        match_ofs = (int)pcVar11 - (int)str_00;
        goto LAB_002890c8;
      }
      bVar2 = true;
    }
    else {
      do {
        pbVar10 = pbVar10 + (ulong)(((*pbVar10 >> 5 & 1) != 0) + 1 & (uint)(*pbVar10 >> 7) * 3) + 1;
        uVar12 = uVar12 - 1;
      } while (uVar12 != 0);
      match_ofs = (int)pbVar10 - (int)str_00;
      bVar2 = true;
      if (match_ofs < (int)len) {
        match_len = 0;
LAB_002890c8:
        pCVar5 = local_68;
        bVar2 = false;
        CVmObjList::cons_ensure_space((CVmObjList *)local_68,uVar13,0);
        bytelen = (size_t)match_ofs;
        ele.val.obj = create(0,(char *)str_00,bytelen);
        ele.typ = VM_OBJ;
        CVmObjList::cons_set_element((CVmObjList *)pCVar5,uVar13,&ele);
        lVar16 = bytelen + (long)match_len;
        str_00 = str_00 + lVar16;
        len = len - lVar16;
        uVar15 = local_5c;
        if (((local_5c == 0) && (bVar2 = false, match_len == 0)) && (bVar2 = false, len != 0)) {
          bVar2 = false;
          str_00 = str_00 + (ulong)(((*str_00 >> 5 & 1) != 0) + 1 & (uint)(*str_00 >> 7) * 3) + 1;
        }
      }
    }
    if (bVar2) goto LAB_0028916c;
    uVar13 = uVar13 + 1;
  } while( true );
}

Assistant:

int CVmObjString::getp_split(VMG_ vm_val_t *retval,
                             const vm_val_t *self_val,
                             const char *str, uint *argcp)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(0, 2);
    uint argc = (argcp != 0 ? *argcp : 0);
    if (get_prop_check_argc(retval, argcp, &desc))
        return TRUE;

    /* get the string buffer and length */
    size_t len = vmb_get_len(str);
    str += VMB_LEN;

    /* remember the start of the base string */
    const char *basestr = str;

    /* 
     *   Get the delimiter or split size, leaving it on the stack for gc
     *   protection.  This can be a string, a RexPattern, or an integer.  
     */
    const vm_val_t *delim = G_stk->get(0);
    const char *delim_str = 0;
    CVmObjPattern *delim_pat = 0;
    int split_len = 0;
    if (argc < 1 || delim->typ == VM_NIL)
    {
        /* there's no delimiter at all, so use the default split length 1 */
        split_len = 1;
    }
    else if (delim->typ == VM_INT)
    {
        /* it's a simple split length */
        split_len = delim->val.intval;
        if (split_len <= 0)
            err_throw(VMERR_BAD_VAL_BIF);
    }
    else if ((delim_str = delim->get_as_string(vmg0_)) == 0)
    {
        /* if it's not a length or string, it has to be a RexPattern object */
        if (delim->typ != VM_OBJ
            || !CVmObjPattern::is_pattern_obj(vmg_ delim->val.obj))
            err_throw(VMERR_BAD_TYPE_BIF);

        /* get the pattern object, properly cast */
        delim_pat = (CVmObjPattern *)vm_objp(vmg_ delim->val.obj);
    }

    /* get the split count limit, if there is one */
    int32_t limit = -1;
    if (argc >= 2 && G_stk->get(1)->typ != VM_NIL)
    {
        /* there's an explicit limit; fetch it and make sure it's at least 1 */
        if ((limit = G_stk->get(1)->num_to_int(vmg0_)) < 1)
            err_throw(VMERR_BAD_VAL_BIF);
    }

    /* push 'self' for gc protection */
    G_stk->push(self_val);

    /* 
     *   Set up a return list.  If we have a limit, the list can't go over
     *   that length, so just create the list at the limit.  Otherwise, if we
     *   have a split length, we can figure the required list length by
     *   dividing the string length by the split length (rounding up).
     *   Otherwise we have no idea how many list elements we'll need, so just
     *   create the list at an arbitrary default length and expand later if
     *   needed.  
     */
    int init_list_len;
    if (limit > 0)
    {
        /* there's a limit, so we won't need more than this many elements */
        init_list_len = limit;
    }
    else if (split_len > 0)
    {
        /* split length -> divide the string length by the split length */
        init_list_len = (len + split_len - 1)/split_len;

        /* set the length to at least one, unless it's an empty string */
        if (init_list_len < 1 && len != 0)
            init_list_len = 1;
    }
    else
    {
        /* no limit or length, so start with an arbitrary guess */
        init_list_len = 10;
    }

    /* create the list */
    retval->set_obj(CVmObjList::create(vmg_ FALSE, init_list_len));
    CVmObjList *lst = (CVmObjList *)vm_objp(vmg_ retval->val.obj);

    /* clear the list to nils, since we're building it incrementally */
    lst->cons_clear();

    /* push it for gc protection */
    G_stk->push(retval);

    /* repeatedly search for the delimiter and split the string */
    int cnt;
    vm_val_t ele;
    for (cnt = 0 ; (limit < 0 || cnt + 1 < limit) && len != 0 ; ++cnt)
    {
        /* search for the next delimiter or next 'split_len' characters */
        int match_ofs, match_len;
        if (split_len > 0)
        {
            /* figure the number of bytes in split_len characters */
            match_ofs = utf8_ptr::s_bytelen(str, split_len);

            /* if that uses the whole rest of the string, we're done */
            if (match_ofs >= (int)len)
                break;

            /* there's no delimiter, so the delimiter match length is zero */
            match_len = 0;
        }
        else
        {
            /* search for the substring or pattern */
            const char *nxt = find_substr(
                vmg_ self_val, basestr, str, len, delim_str, delim_pat,
                &match_ofs, &match_len);

            /* if we didn't find it, we're done */
            if (nxt == 0)
                break;

            /* figure the byte offset to the match */
            match_ofs = nxt - str;
        }

        /* add the substring from 'str' to 'p' to the list */
        lst->cons_ensure_space(vmg_ cnt, 0);
        ele.set_obj(CVmObjString::create(vmg_ FALSE, str, match_ofs));
        lst->cons_set_element(cnt, &ele);

        /* skip to the position after the match */
        size_t skip = match_ofs + match_len;
        str += skip;
        len -= skip;

        /* 
         *   if we matched zero characters, skip one character to prevent an
         *   infinite loop 
         */
        if (split_len == 0 && match_len == 0 && len != 0)
            str += utf8_ptr::s_bytelen(str, 1);
    }

    /* add a final element for the remainder of the string */
    if (len != 0)
    {
        lst->cons_ensure_space(vmg_ cnt, 0);
        ele.set_obj(CVmObjString::create(vmg_ FALSE, str, len));
        lst->cons_set_element(cnt, &ele);

        /* count it */
        ++cnt;
    }

    /* set the final size of the list */
    lst->cons_set_len(cnt);

    /* discard arguments plus gc protection */
    G_stk->discard(argc + 2);

    /* handled */
    return TRUE;
}